

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O2

bool __thiscall
cmQtAutoGenerators::ReadOldMocDefinitionsFile
          (cmQtAutoGenerators *this,cmMakefile *makefile,string *targetDirectory)

{
  bool bVar1;
  string filename;
  allocator local_59;
  string local_58;
  string local_38;
  
  cmsys::SystemTools::CollapseFullPath(&local_58,targetDirectory);
  cmsys::SystemTools::ConvertToUnixSlashes(&local_58);
  std::__cxx11::string::append((char *)&local_58);
  bVar1 = cmMakefile::ReadListFile(makefile,local_58._M_dataplus._M_p);
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_38,"AM_OLD_COMPILE_SETTINGS",&local_59);
    cmMakefile::GetSafeDefinition(makefile,&local_38);
    std::__cxx11::string::assign((char *)&this->OldCompileSettingsStr);
    std::__cxx11::string::~string((string *)&local_38);
  }
  std::__cxx11::string::~string((string *)&local_58);
  return true;
}

Assistant:

bool cmQtAutoGenerators::ReadOldMocDefinitionsFile(cmMakefile* makefile,
                                            const std::string& targetDirectory)
{
  std::string filename(
      cmSystemTools::CollapseFullPath(targetDirectory));
  cmSystemTools::ConvertToUnixSlashes(filename);
  filename += "/AutomocOldMocDefinitions.cmake";

  if (makefile->ReadListFile(filename.c_str()))
    {
    this->OldCompileSettingsStr =
                        makefile->GetSafeDefinition("AM_OLD_COMPILE_SETTINGS");
    }
  return true;
}